

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZydisFuzzShared.c
# Opt level: O1

void ZydisValidateEnumRanges
               (ZydisDecodedInstruction *insn,ZydisDecodedOperand *operands,ZyanU8 operand_count)

{
  undefined2 uVar1;
  undefined2 uVar2;
  uint uVar3;
  ZydisInstructionCategory ZVar4;
  ZydisISASet ZVar5;
  ZydisISAExt ZVar6;
  ZydisBranchType ZVar7;
  ZydisExceptionClass ZVar8;
  ZydisMemoryOperandType ZVar9;
  ZydisSwizzleMode ZVar10;
  ZydisOperandType ZVar11;
  ZydisSwizzleMode ZVar12;
  ZyanStatus ZVar13;
  ZyanStatus ZVar14;
  int iVar15;
  long lVar16;
  ulong extraout_RAX;
  ZydisDecodedInstruction *in_RCX;
  ulong uVar17;
  ZyanI64 *result_address;
  ZydisDecodedInstruction *extraout_RDX;
  ZydisDecodedOperand *operands_00;
  ZydisDecodedInstruction *unaff_RBX;
  ZydisDecodedOperand *pZVar18;
  byte bVar19;
  ulong unaff_RBP;
  char *__format;
  ZydisDecodedInstruction *instruction;
  ZydisDecodedInstruction *pZVar20;
  ZydisDecodedInstruction *instruction_00;
  ZydisDecoder *decoder;
  ZyanU8 *in_R8;
  ZydisDecodedInstruction *unaff_R12;
  ZyanI64 *pZVar21;
  ulong unaff_R13;
  ulong uVar22;
  ZydisDecodedInstruction *instruction_01;
  long lVar23;
  bool bVar24;
  bool bVar25;
  ZyanU8 aZStack_6df [15];
  ZyanUSize ZStack_6d0;
  ZyanUSize ZStack_6c8;
  undefined1 auStack_6bf [15];
  ZydisDecodedInstruction ZStack_6b0;
  ZydisEncoderRequest ZStack_568;
  ZydisDecodedOperand aZStack_3d8 [10];
  ZydisDecodedInstruction *pZStack_b0;
  ZydisDecodedInstruction *pZStack_a8;
  ulong uStack_a0;
  ZydisDecodedOperand *pZStack_90;
  code *pcStack_88;
  ZydisDecodedInstruction *pZStack_78;
  ZydisDecodedInstruction *pZStack_70;
  ulong uStack_68;
  ulong uStack_60;
  ZydisDecodedInstruction *pZStack_58;
  ZydisDecodedInstruction *pZStack_50;
  
  pZVar18 = operands;
  if (insn->length < 0x10) {
    if (ZYDIS_MACHINE_MODE_MAX_VALUE < insn->machine_mode) goto LAB_0010f50e;
    if (ZYDIS_MNEMONIC_MAX_VALUE < insn->mnemonic) goto LAB_0010f513;
    if (ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE < insn->encoding) goto LAB_0010f518;
    if (ZYDIS_OPCODE_MAP_MAX_VALUE < insn->opcode_map) goto LAB_0010f51d;
    if (operand_count != '\0') {
      unaff_R12 = (ZydisDecodedInstruction *)0x0;
      do {
        uVar3 = *(uint *)((long)&operands->type + (long)unaff_R12);
        if (4 < uVar3) goto LAB_0010f493;
        if (3 < *(uint *)((long)&operands->visibility + (long)unaff_R12)) goto LAB_0010f498;
        if (0x22 < *(uint *)((long)&operands->encoding + (long)unaff_R12)) goto LAB_0010f49f;
        if (10 < *(uint *)((long)&operands->element_type + (long)unaff_R12)) goto LAB_0010f4a6;
        if (uVar3 == 4) {
          if (*(byte *)((long)&operands->field_10 + (long)unaff_R12) < 2) {
            if ((&(operands->field_10).imm.is_relative)[(long)unaff_R12] < 2) {
              ZydisValidateImmediateSize((ulong)(&(operands->field_10).imm.size)[(long)unaff_R12]);
              in_RCX = (ZydisDecodedInstruction *)(ulong)insn->length;
              if ((ZydisDecodedInstruction *)
                  ((ulong)((&(operands->field_10).imm.size)[(long)unaff_R12] >> 3) +
                  (ulong)(&(operands->field_10).mem.scale)[(long)unaff_R12]) <= in_RCX)
              goto LAB_0010f37f;
              goto LAB_0010f4b2;
            }
            ZydisValidateEnumRanges_cold_1();
          }
          ZydisValidateEnumRanges_cold_2();
LAB_0010f4d5:
          ZydisValidateEnumRanges_cold_7();
LAB_0010f4da:
          __format = 
          "Value op->mem.disp.offset + (op->mem.disp.size / 8) = 0x%016lX is above expected max insn->length = 0x%016lX\n"
          ;
          goto LAB_0010f4eb;
        }
        if (uVar3 == 2) {
          if (4 < *(uint *)((long)&operands->field_10 + (long)unaff_R12)) goto LAB_0010f4ad;
          if (*(uint *)((undefined1 *)((long)&operands->field_10 + 4) + (long)unaff_R12) < 0x10b) {
            if (*(uint *)((undefined1 *)((long)&operands->field_10 + 8) + (long)unaff_R12) < 0x10b)
            {
              if (*(uint *)((undefined1 *)((long)&operands->field_10 + 0xc) + (long)unaff_R12) <
                  0x10b) {
                ZydisValidateImmediateSize
                          ((ulong)(byte)((undefined1 *)((long)&operands->field_10 + 0x21))
                                        [(long)unaff_R12]);
                in_RCX = (ZydisDecodedInstruction *)(ulong)insn->length;
                if ((ZydisDecodedInstruction *)
                    ((ulong)((byte)((undefined1 *)((long)&operands->field_10 + 0x21))
                                   [(long)unaff_R12] >> 3) +
                    (ulong)(byte)((undefined1 *)((long)&operands->field_10 + 0x20))[(long)unaff_R12]
                    ) <= in_RCX) goto LAB_0010f37f;
                goto LAB_0010f4da;
              }
              ZydisValidateEnumRanges_cold_3();
            }
            ZydisValidateEnumRanges_cold_4();
          }
          ZydisValidateEnumRanges_cold_5();
          unaff_RBX = insn;
          goto LAB_0010f506;
        }
        if ((uVar3 == 1) && (0x10a < *(uint *)((long)&operands->field_10 + (long)unaff_R12)))
        goto LAB_0010f4d5;
LAB_0010f37f:
        unaff_R12 = (ZydisDecodedInstruction *)&(unaff_R12->avx).swizzle;
      } while ((ZydisDecodedInstruction *)((ulong)operand_count * 0x50) != unaff_R12);
    }
    if (ZYDIS_MASK_MODE_CONTROL_ZEROING < (insn->avx).mask.mode) goto LAB_0010f522;
    if (ZYDIS_REGISTER_IA32_KERNEL_GS_BASE < (insn->avx).mask.reg) goto LAB_0010f527;
    if (1 < (insn->avx).broadcast.is_static) goto LAB_0010f52c;
    if (ZYDIS_BROADCAST_MODE_8_TO_16 < (insn->avx).broadcast.mode) goto LAB_0010f534;
    if (ZYDIS_ROUNDING_MODE_MAX_VALUE < (insn->avx).rounding.mode) goto LAB_0010f539;
    if (ZYDIS_SWIZZLE_MODE_DDDD < (insn->avx).swizzle.mode) goto LAB_0010f53e;
    if (ZYDIS_CONVERSION_MODE_MAX_VALUE < (insn->avx).conversion.mode) goto LAB_0010f543;
    if (1 < (insn->avx).has_sae) goto LAB_0010f548;
    bVar19 = (insn->avx).has_eviction_hint;
    uVar17 = (ulong)bVar19;
    if (1 < bVar19) goto LAB_0010f550;
    ZVar4 = (insn->meta).category;
    pZVar20 = (ZydisDecodedInstruction *)(ulong)ZVar4;
    if (ZYDIS_CATEGORY_MAX_VALUE < ZVar4) goto LAB_0010f558;
    ZVar5 = (insn->meta).isa_set;
    pZVar20 = (ZydisDecodedInstruction *)(ulong)ZVar5;
    if (ZYDIS_ISA_SET_MAX_VALUE < ZVar5) goto LAB_0010f55d;
    ZVar6 = (insn->meta).isa_ext;
    pZVar20 = (ZydisDecodedInstruction *)(ulong)ZVar6;
    if (199 < ZVar6) goto LAB_0010f562;
    ZVar7 = (insn->meta).branch_type;
    pZVar20 = (ZydisDecodedInstruction *)(ulong)ZVar7;
    if (ZYDIS_BRANCH_TYPE_FAR < ZVar7) goto LAB_0010f567;
    ZVar8 = (insn->meta).exception_class;
    pZVar20 = (ZydisDecodedInstruction *)(ulong)ZVar8;
    if (ZVar8 < (ZYDIS_EXCEPTION_CLASS_AMXE5|ZYDIS_EXCEPTION_CLASS_SSE2)) {
      lVar16 = 0;
      do {
        if (ZYDIS_PREFIX_TYPE_MANDATORY < (insn->raw).prefixes[lVar16].type) {
          ZydisValidateEnumRanges_cold_14();
          goto LAB_0010f483;
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 != 0xf);
      lVar16 = 0;
      while ((&(insn->raw).imm[0].is_signed)[lVar16] < 2) {
        if (1 < (&(insn->raw).imm[0].is_relative)[lVar16]) goto LAB_0010f48b;
        lVar16 = lVar16 + 0x18;
        if (lVar16 != 0x18) {
          return;
        }
      }
LAB_0010f483:
      ZydisValidateEnumRanges_cold_13();
LAB_0010f48b:
      ZydisValidateEnumRanges_cold_12();
LAB_0010f493:
      ZydisValidateEnumRanges_cold_11();
LAB_0010f498:
      ZydisValidateEnumRanges_cold_10();
LAB_0010f49f:
      ZydisValidateEnumRanges_cold_9();
LAB_0010f4a6:
      ZydisValidateEnumRanges_cold_8();
LAB_0010f4ad:
      ZydisValidateEnumRanges_cold_6();
LAB_0010f4b2:
      __format = 
      "Value op->imm.offset + (op->imm.size / 8) = 0x%016lX is above expected max insn->length = 0x%016lX\n"
      ;
LAB_0010f4eb:
      fprintf(_stderr,__format);
      abort();
    }
  }
  else {
LAB_0010f506:
    insn = unaff_RBX;
    ZydisValidateEnumRanges_cold_33();
LAB_0010f50e:
    ZydisValidateEnumRanges_cold_32();
LAB_0010f513:
    ZydisValidateEnumRanges_cold_31();
LAB_0010f518:
    ZydisValidateEnumRanges_cold_30();
LAB_0010f51d:
    ZydisValidateEnumRanges_cold_29();
LAB_0010f522:
    ZydisValidateEnumRanges_cold_28();
LAB_0010f527:
    ZydisValidateEnumRanges_cold_27();
LAB_0010f52c:
    ZydisValidateEnumRanges_cold_26();
LAB_0010f534:
    ZydisValidateEnumRanges_cold_25();
LAB_0010f539:
    ZydisValidateEnumRanges_cold_24();
LAB_0010f53e:
    ZydisValidateEnumRanges_cold_23();
LAB_0010f543:
    ZydisValidateEnumRanges_cold_22();
LAB_0010f548:
    ZydisValidateEnumRanges_cold_21();
    uVar17 = extraout_RAX;
LAB_0010f550:
    pZVar20 = (ZydisDecodedInstruction *)(uVar17 & 0xff);
    ZydisValidateEnumRanges_cold_20();
LAB_0010f558:
    ZydisValidateEnumRanges_cold_19();
LAB_0010f55d:
    ZydisValidateEnumRanges_cold_18();
LAB_0010f562:
    ZydisValidateEnumRanges_cold_17();
LAB_0010f567:
    ZydisValidateEnumRanges_cold_16();
  }
  ZydisValidateEnumRanges_cold_15();
  if (((((pZVar20->mnemonic == ZYDIS_MNEMONIC_XCHG) && (pZVar20->operand_count == '\x02')) &&
       (pZVar18->type == ZYDIS_OPERAND_TYPE_REGISTER)) &&
      ((pZVar18[1].type == ZYDIS_OPERAND_TYPE_REGISTER &&
       (ZVar9 = (pZVar18->field_10).mem.type, ZVar9 == pZVar18[1].field_10.mem.type)))) &&
     ((extraout_RDX->mnemonic == ZYDIS_MNEMONIC_NOP &&
      (((ZVar9 == 0x15 || (ZVar9 == 0x35)) ||
       ((ZVar9 == 0x25 && (pZVar20->machine_mode != ZYDIS_MACHINE_MODE_LONG_64)))))))) {
    return;
  }
  instruction = (ZydisDecodedInstruction *)(ulong)pZVar20->machine_mode;
  ZVar12 = (pZVar20->avx).swizzle.mode;
  if (ZVar12 == ZYDIS_SWIZZLE_MODE_DCBA) {
    ZVar12 = ZYDIS_SWIZZLE_MODE_INVALID;
  }
  ZVar10 = (extraout_RDX->avx).swizzle.mode;
  uVar17 = (ulong)ZVar10;
  if (ZVar10 == ZYDIS_SWIZZLE_MODE_DCBA) {
    uVar17 = 0;
  }
  instruction_00 = unaff_R12;
  pZStack_58 = insn;
  pZStack_50 = unaff_R12;
  if ((((((pZVar20->machine_mode == extraout_RDX->machine_mode) &&
         (pZVar20->mnemonic == extraout_RDX->mnemonic)) &&
        (pZVar20->stack_width == extraout_RDX->stack_width)) &&
       ((pZVar20->operand_count == extraout_RDX->operand_count &&
        ((pZVar20->avx).mask.mode == (extraout_RDX->avx).mask.mode)))) &&
      ((((pZVar20->avx).broadcast.is_static == (extraout_RDX->avx).broadcast.is_static &&
        (((pZVar20->avx).broadcast.mode == (extraout_RDX->avx).broadcast.mode &&
         ((pZVar20->avx).conversion.mode == (extraout_RDX->avx).conversion.mode)))) &&
       ((pZVar20->avx).rounding.mode == (extraout_RDX->avx).rounding.mode)))) &&
     ((((pZVar20->avx).has_sae == (extraout_RDX->avx).has_sae &&
       ((pZVar20->avx).has_eviction_hint == (extraout_RDX->avx).has_eviction_hint)) &&
      (ZVar12 == (ZydisSwizzleMode)uVar17)))) {
    if (pZVar20->operand_count == '\0') {
      return;
    }
    unaff_RBP = 0;
    instruction_00 = pZVar20;
    instruction_01 = extraout_RDX;
    pZStack_78 = pZVar20;
    pZStack_70 = extraout_RDX;
    while (ZVar11 = pZVar18->type, ZVar11 == *(ZydisOperandType *)&in_RCX->attributes) {
      uVar1 = pZVar18->size;
      uVar2 = (undefined2)in_RCX->opcode_map;
      uVar17 = (ulong)(ushort)uVar2;
      instruction = (ZydisDecodedInstruction *)
                    CONCAT71((int7)((ulong)instruction >> 8),uVar1 == uVar2);
      if (ZVar11 != ZYDIS_OPERAND_TYPE_IMMEDIATE && uVar1 != uVar2) break;
      pZVar20 = instruction_00;
      switch(ZVar11) {
      case ZYDIS_OPERAND_TYPE_REGISTER:
        if ((pZVar18->field_10).mem.type !=
            (((anon_union_40_4_4687af53_for_ZydisDecodedOperand__10 *)&in_RCX->cpu_flags)->mem).type
           ) goto LAB_0010f885;
        break;
      case ZYDIS_OPERAND_TYPE_MEMORY:
        if (instruction_01->length <= instruction_00->length) {
          pcStack_88 = (code *)0x10f793;
          ZVar14 = ZydisCalcAbsoluteAddress(instruction_00,pZVar18,0,&uStack_60);
          unaff_R13 = (ulong)ZVar14;
          pcStack_88 = (code *)0x10f7b4;
          instruction = in_RCX;
          ZVar13 = ZydisCalcAbsoluteAddress
                             (instruction_01,(ZydisDecodedOperand *)in_RCX,
                              (ulong)instruction_00->length - (ulong)instruction_01->length,
                              &uStack_68);
          bVar24 = (int)(ZVar13 | ZVar14) < 0;
          if ((bVar24) || (uStack_60 == uStack_68)) {
            ZVar9 = (pZVar18->field_10).mem.type;
            uVar17 = (ulong)ZVar9;
            if (((ZVar9 == (((anon_union_40_4_4687af53_for_ZydisDecodedOperand__10 *)
                            &in_RCX->cpu_flags)->mem).type) &&
                (((((pZVar18->field_10).mem.segment ==
                    (((anon_union_40_4_4687af53_for_ZydisDecodedOperand__10 *)&in_RCX->cpu_flags)->
                    mem).segment &&
                   ((pZVar18->field_10).mem.base == *(ZydisRegister *)&in_RCX->fpu_flags)) &&
                  ((pZVar18->field_10).mem.index == *(ZydisRegister *)((long)&in_RCX->fpu_flags + 4)
                  )) && ((ZVar9 == ZYDIS_MEMOP_TYPE_MIB ||
                         (bVar19 = (byte)(in_RCX->avx).vector_length, uVar17 = (ulong)bVar19,
                         (pZVar18->field_10).mem.scale == bVar19)))))) &&
               (bVar25 = (pZVar18->field_10).mem.disp.value == *(long *)&(in_RCX->avx).mask.reg,
               uVar17 = (ulong)bVar25, pZVar20 = pZStack_78, unaff_R12 = instruction_00,
               instruction_01 = pZStack_70, !bVar24 || bVar25)) break;
            goto LAB_0010f860;
          }
          goto LAB_0010f897;
        }
        goto LAB_0010f880;
      case ZYDIS_OPERAND_TYPE_POINTER:
        if (((pZVar18->field_10).ptr.segment !=
             (((anon_union_40_4_4687af53_for_ZydisDecodedOperand__10 *)&in_RCX->cpu_flags)->ptr).
             segment) ||
           ((pZVar18->field_10).mem.segment !=
            (((anon_union_40_4_4687af53_for_ZydisDecodedOperand__10 *)&in_RCX->cpu_flags)->mem).
            segment)) goto LAB_0010f86e;
        break;
      case ZYDIS_OPERAND_TYPE_IMMEDIATE:
        if ((((pZVar18->field_10).imm.is_relative !=
              (((anon_union_40_4_4687af53_for_ZydisDecodedOperand__10 *)&in_RCX->cpu_flags)->imm).
              is_relative) ||
            ((pZVar18->field_10).imm.is_signed !=
             (((anon_union_40_4_4687af53_for_ZydisDecodedOperand__10 *)&in_RCX->cpu_flags)->imm).
             is_signed)) ||
           ((ZydisAccessedFlags *)(pZVar18->field_10).imm.value.u != in_RCX->fpu_flags)) {
          ZVar4 = (instruction_00->meta).category;
          if ((ZVar4 != ZYDIS_CATEGORY_LOGICAL) && (ZVar4 != ZYDIS_CATEGORY_DATAXFER))
          goto LAB_0010f877;
          if ((ushort)uVar2 < (ushort)uVar1) {
            uVar17 = (ulong)(ushort)uVar1;
          }
          if ((ushort)uVar17 < 0x40) {
            bVar19 = (byte)uVar17;
            uVar17 = (ulong)in_RCX->fpu_flags ^ (pZVar18->field_10).imm.value.u;
            bVar24 = (uVar17 & ~(-1L << (bVar19 & 0x3f))) == 0;
          }
          else {
            bVar24 = (ZydisAccessedFlags *)(pZVar18->field_10).imm.value.u == in_RCX->fpu_flags;
          }
          if (!bVar24) goto LAB_0010f877;
        }
        break;
      default:
        goto switchD_0010f6e1_default;
      }
      bVar19 = (char)unaff_RBP + 1;
      unaff_RBP = (ulong)bVar19;
      in_RCX = (ZydisDecodedInstruction *)&(in_RCX->avx).swizzle;
      pZVar18 = pZVar18 + 1;
      instruction_00 = pZVar20;
      if (pZVar20->operand_count <= bVar19) {
        return;
      }
    }
    pcStack_88 = (code *)0x10f860;
    ZydisValidateInstructionIdentity_cold_2();
    instruction_00 = unaff_R12;
LAB_0010f860:
    pcStack_88 = (code *)0x10f869;
    ZydisValidateInstructionIdentity_cold_6();
  }
  pcStack_88 = (code *)0x10f86e;
  ZydisValidateInstructionIdentity_cold_1();
  unaff_R12 = instruction_00;
LAB_0010f86e:
  pcStack_88 = (code *)0x10f877;
  ZydisValidateInstructionIdentity_cold_4();
LAB_0010f877:
  pcStack_88 = (code *)0x10f880;
  ZydisValidateInstructionIdentity_cold_3();
LAB_0010f880:
  pcStack_88 = (code *)0x10f885;
  ZydisValidateInstructionIdentity_cold_7();
LAB_0010f885:
  pcStack_88 = (code *)0x10f88e;
  ZydisValidateInstructionIdentity_cold_8();
switchD_0010f6e1_default:
  instruction_00 = unaff_R12;
  pcStack_88 = (code *)0x10f897;
  ZydisValidateInstructionIdentity_cold_9();
  uStack_60 = uVar17;
LAB_0010f897:
  bVar19 = (byte)uStack_60;
  decoder = (ZydisDecoder *)(unaff_RBP & 0xff);
  pcStack_88 = ZydisReEncodeInstruction;
  ZydisValidateInstructionIdentity_cold_5();
  pZStack_b0 = in_RCX;
  pZStack_a8 = instruction_00;
  uStack_a0 = unaff_R13;
  pZStack_90 = pZVar18;
  pcStack_88 = (code *)unaff_RBP;
  ZydisPrintInstruction(instruction,operands_00,bVar19,in_R8);
  ZydisValidateEnumRanges(instruction,operands_00,bVar19);
  if (bVar19 < instruction->operand_count_visible) {
LAB_0010facd:
    __assert_fail("operand_count >= insn1->operand_count_visible",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/tools/ZydisFuzzShared.c"
                  ,0x1dd,
                  "void ZydisReEncodeInstruction(const ZydisDecoder *, const ZydisDecodedInstruction *, const ZydisDecodedOperand *, ZyanU8, const ZyanU8 *)"
                 );
  }
  ZVar14 = ZydisEncoderDecodedInstructionToEncoderRequest
                     (instruction,operands_00,instruction->operand_count_visible,&ZStack_568);
  if ((int)ZVar14 < 0) {
    ZydisReEncodeInstruction_cold_1();
LAB_0010faf1:
    ZydisReEncodeInstruction_cold_2();
LAB_0010faf6:
    ZydisReEncodeInstruction_cold_3();
LAB_0010fafb:
    ZydisReEncodeInstruction_cold_7();
LAB_0010fb00:
    ZydisReEncodeInstruction_cold_6();
  }
  else {
    ZStack_6d0 = 0xf;
    ZVar14 = ZydisEncoderEncodeInstruction(&ZStack_568,aZStack_6df,&ZStack_6d0);
    if ((int)ZVar14 < 0) goto LAB_0010faf1;
    ZVar14 = ZydisDecoderDecodeFull(decoder,aZStack_6df,ZStack_6d0,&ZStack_6b0,aZStack_3d8);
    if ((int)ZVar14 < 0) goto LAB_0010faf6;
    pZVar18 = aZStack_3d8;
    ZydisPrintInstruction(&ZStack_6b0,pZVar18,ZStack_6b0.operand_count_visible,aZStack_6df);
    ZydisValidateEnumRanges(&ZStack_6b0,pZVar18,ZStack_6b0.operand_count_visible);
    ZydisValidateInstructionIdentity(instruction,operands_00,&ZStack_6b0,pZVar18);
    uVar17 = (ulong)ZStack_6b0.length;
    if (instruction->length < ZStack_6b0.length) goto LAB_0010fafb;
    lVar16 = 0x8000;
    if (ZStack_6b0.address_width != '\x10') {
      if (ZStack_6b0.address_width == '@') {
        lVar16 = -0x8000000000000000;
      }
      else {
        if (ZStack_6b0.address_width != ' ') goto LAB_0010fb0a;
        lVar16 = 0x80000000;
      }
    }
    lVar23 = 0x8000;
    if (ZStack_6b0.operand_width != '\x10') {
      lVar23 = lVar16;
    }
    if (ZStack_6b0.machine_mode == ZYDIS_MACHINE_MODE_LONG_64) {
      lVar23 = lVar16;
    }
    if (ZStack_568.operand_count == 0) {
      return;
    }
    pZVar21 = &ZStack_568.operands[0].mem.displacement;
    uVar22 = 0;
    bVar24 = false;
    do {
      if ((int)pZVar21[-4] == 2) {
        result_address = pZVar21;
        if (((pZVar18->field_10).mem.base & ~ZYDIS_REGISTER_AL) != ZYDIS_REGISTER_EIP)
        goto LAB_0010fa3b;
      }
      else if (((int)pZVar21[-4] == 4) && ((pZVar18->field_10).imm.is_relative != '\0')) {
        result_address = pZVar21 + 3;
      }
      else {
LAB_0010fa3b:
        result_address = (ZyanI64 *)0x0;
      }
      if (result_address != (ZyanI64 *)0x0) {
        ZVar14 = ZydisCalcAbsoluteAddress
                           (&ZStack_6b0,pZVar18,lVar23 - uVar17,(ZyanU64 *)result_address);
        bVar24 = true;
        if ((int)ZVar14 < 0) {
          ZydisReEncodeInstruction_cold_4();
          goto LAB_0010facd;
        }
      }
      uVar22 = uVar22 + 1;
      pZVar21 = pZVar21 + 8;
      pZVar18 = pZVar18 + 1;
    } while (uVar22 < ZStack_568.operand_count);
    if (!bVar24) {
      return;
    }
    ZStack_6c8 = 0xf;
    ZVar14 = ZydisEncoderEncodeInstructionAbsolute
                       (&ZStack_568,auStack_6bf,&ZStack_6c8,lVar23 - uVar17);
    if (-1 < (int)ZVar14) {
      if ((ZStack_6c8 == ZStack_6b0.length) &&
         (iVar15 = bcmp(auStack_6bf,aZStack_6df,(ulong)ZStack_6b0.length), iVar15 == 0)) {
        return;
      }
      goto LAB_0010fb00;
    }
  }
  ZydisReEncodeInstruction_cold_5();
LAB_0010fb0a:
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/tools/ZydisFuzzShared.c"
                ,0x196,
                "void ZydisReEncodeInstructionAbsolute(ZydisEncoderRequest *, const ZydisDecodedInstruction *, const ZydisDecodedOperand *, const ZyanU8 *)"
               );
}

Assistant:

void ZydisValidateEnumRanges(const ZydisDecodedInstruction* insn,
    const ZydisDecodedOperand* operands, ZyanU8 operand_count)
{
#   define ZYDIS_CHECK_ENUM(value, max)                                                            \
    if ((ZyanU64)(value) > (ZyanU64)(max))                                                         \
    {                                                                                              \
        fprintf(stderr, "Value " #value " = 0x%016" PRIX64 " is above expected max " #max          \
            " = 0x%016" PRIX64 "\n", (ZyanU64)(value), (ZyanU64)(max));                            \
        abort();                                                                                   \
    }
#   define ZYDIS_CHECK_MAX ZYDIS_CHECK_ENUM

    ZYDIS_CHECK_ENUM(insn->length, ZYDIS_MAX_INSTRUCTION_LENGTH);

    ZYDIS_CHECK_ENUM(insn->machine_mode, ZYDIS_MACHINE_MODE_MAX_VALUE);
    ZYDIS_CHECK_ENUM(insn->mnemonic, ZYDIS_MNEMONIC_MAX_VALUE);
    ZYDIS_CHECK_ENUM(insn->encoding, ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE);
    ZYDIS_CHECK_ENUM(insn->opcode_map, ZYDIS_OPCODE_MAP_MAX_VALUE);
    ZYDIS_CHECK_ENUM(insn->opcode_map, ZYDIS_OPCODE_MAP_MAX_VALUE);

    // Operands.
    for (ZyanU32 i = 0; i < operand_count; ++i)
    {
        const ZydisDecodedOperand* op = &operands[i];
        ZYDIS_CHECK_ENUM(op->type, ZYDIS_OPERAND_TYPE_MAX_VALUE);
        ZYDIS_CHECK_ENUM(op->visibility, ZYDIS_OPERAND_VISIBILITY_MAX_VALUE);
        ZYDIS_CHECK_ENUM(op->encoding, ZYDIS_OPERAND_ENCODING_MAX_VALUE);
        ZYDIS_CHECK_ENUM(op->element_type, ZYDIS_ELEMENT_TYPE_MAX_VALUE);

        switch (op->type)
        {
        case ZYDIS_OPERAND_TYPE_REGISTER:
            ZYDIS_CHECK_ENUM(op->reg.value, ZYDIS_REGISTER_MAX_VALUE);
            break;
        case ZYDIS_OPERAND_TYPE_MEMORY:
            ZYDIS_CHECK_ENUM(op->mem.type, ZYDIS_MEMOP_TYPE_MAX_VALUE);
            ZYDIS_CHECK_ENUM(op->mem.segment, ZYDIS_REGISTER_MAX_VALUE);
            ZYDIS_CHECK_ENUM(op->mem.base, ZYDIS_REGISTER_MAX_VALUE);
            ZYDIS_CHECK_ENUM(op->mem.index, ZYDIS_REGISTER_MAX_VALUE);
            ZydisValidateImmediateSize(op->mem.disp.size);
            ZYDIS_CHECK_MAX(op->mem.disp.offset + (op->mem.disp.size / 8), insn->length);
            break;
        case ZYDIS_OPERAND_TYPE_IMMEDIATE:
            ZYDIS_CHECK_ENUM(op->imm.is_signed, ZYAN_TRUE);
            ZYDIS_CHECK_ENUM(op->imm.is_relative, ZYAN_TRUE);
            ZydisValidateImmediateSize(op->imm.size);
            ZYDIS_CHECK_MAX(op->imm.offset + (op->imm.size / 8), insn->length);
            break;
        default:
            break;
        }
    }

    // AVX.
    ZYDIS_CHECK_ENUM(insn->avx.mask.mode, ZYDIS_MASK_MODE_MAX_VALUE);
    ZYDIS_CHECK_ENUM(insn->avx.mask.reg, ZYDIS_REGISTER_MAX_VALUE);
    ZYDIS_CHECK_ENUM(insn->avx.broadcast.is_static, ZYAN_TRUE);
    ZYDIS_CHECK_ENUM(insn->avx.broadcast.mode, ZYDIS_BROADCAST_MODE_MAX_VALUE);
    ZYDIS_CHECK_ENUM(insn->avx.rounding.mode, ZYDIS_ROUNDING_MODE_MAX_VALUE);
    ZYDIS_CHECK_ENUM(insn->avx.swizzle.mode, ZYDIS_SWIZZLE_MODE_MAX_VALUE);
    ZYDIS_CHECK_ENUM(insn->avx.conversion.mode, ZYDIS_CONVERSION_MODE_MAX_VALUE);
    ZYDIS_CHECK_ENUM(insn->avx.has_sae, ZYAN_TRUE);
    ZYDIS_CHECK_ENUM(insn->avx.has_eviction_hint, ZYAN_TRUE);

    // Meta.
    ZYDIS_CHECK_ENUM(insn->meta.category, ZYDIS_CATEGORY_MAX_VALUE);
    ZYDIS_CHECK_ENUM(insn->meta.isa_set, ZYDIS_ISA_SET_MAX_VALUE);
    ZYDIS_CHECK_ENUM(insn->meta.isa_ext, ZYDIS_ISA_SET_MAX_VALUE);
    ZYDIS_CHECK_ENUM(insn->meta.branch_type, ZYDIS_BRANCH_TYPE_MAX_VALUE);
    ZYDIS_CHECK_ENUM(insn->meta.exception_class, ZYDIS_EXCEPTION_CLASS_MAX_VALUE);

    // Raw.
    for (ZyanU32 i = 0; i < ZYAN_ARRAY_LENGTH(insn->raw.prefixes); ++i)
    {
        ZYDIS_CHECK_ENUM(insn->raw.prefixes[i].type, ZYDIS_PREFIX_TYPE_MAX_VALUE);
    }
    for (ZyanU32 i = 0; i < ZYAN_ARRAY_LENGTH(insn->raw.imm); ++i)
    {
        ZYDIS_CHECK_ENUM(insn->raw.imm[i].is_signed, ZYAN_TRUE);
        ZYDIS_CHECK_ENUM(insn->raw.imm[i].is_relative, ZYAN_TRUE);
    }

#   undef ZYDIS_CHECK_ENUM
#   undef ZYDIS_CHECK_MAX
}